

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_random.hpp
# Opt level: O3

int __thiscall iutest::detail::iuRandom::init(iuRandom *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (GetIndefiniteValue()::s == '\0') {
    init(this,ctx);
  }
  uVar1 = GetIndefiniteValue()::s * 0x19660d + 0x3c6ef35f;
  uVar2 = (uVar1 >> 0x1e ^ uVar1) * 0x6c078965 + 0x6c078965;
  uVar3 = (uVar2 >> 0x1e ^ uVar2) * 0x6c078965 + 0xd80f12ca;
  GetIndefiniteValue()::s = uVar1;
  (this->m_engine).m_v1 = (uVar3 >> 0x1e ^ uVar3) * 0x6c078965 + 0x44169c2f;
  (this->m_engine).m_v2 = uVar3;
  (this->m_engine).m_v3 = uVar2;
  (this->m_engine).m_v4 = uVar1;
  return uVar1;
}

Assistant:

void init()
    {
        init(GetIndefiniteValue());
    }